

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O2

string * __thiscall
Diligent::GetContextObjectName_abi_cxx11_
          (string *__return_storage_ptr__,Diligent *this,char *Object,bool bIsDeferred,
          Uint32 ContextId)

{
  ostream *poVar1;
  stringstream ss;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::operator<<(local_1a0,(char *)this);
  if ((char)Object == '\0') {
    std::operator<<(local_1a0," of immediate context");
  }
  else {
    poVar1 = std::operator<<(local_1a0," of deferred context #");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

static std::string GetContextObjectName(const char* Object, bool bIsDeferred, Uint32 ContextId)
{
    std::stringstream ss;
    ss << Object;
    if (bIsDeferred)
        ss << " of deferred context #" << ContextId;
    else
        ss << " of immediate context";
    return ss.str();
}